

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O1

Node * __thiscall AvlTree::insert(AvlTree *this,Node *node,int value)

{
  Node *node_00;
  Node *pNVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (node == (Node *)0x0) {
    node = (Node *)operator_new(0x20);
    node->value = value;
    node->leftChild = (Node *)0x0;
    node->rightChild = (Node *)0x0;
    node->height = 1;
  }
  else {
    lVar5 = 8;
    if ((value < node->value) || (lVar5 = 0x10, node->value < value)) {
      pNVar1 = insert(this,*(Node **)((long)&node->value + lVar5),value);
      *(Node **)((long)&node->value + lVar5) = pNVar1;
      pNVar1 = node->leftChild;
      iVar2 = 0;
      iVar3 = 0;
      if (pNVar1 != (Node *)0x0) {
        iVar3 = pNVar1->height;
      }
      node_00 = node->rightChild;
      if (node_00 != (Node *)0x0) {
        iVar2 = node_00->height;
      }
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
      iVar4 = 0;
      node->height = iVar2 + 1;
      iVar3 = 0;
      if (pNVar1 != (Node *)0x0) {
        iVar3 = pNVar1->height;
      }
      if (node_00 != (Node *)0x0) {
        iVar4 = node_00->height;
      }
      iVar3 = iVar3 - iVar4;
      if ((1 < iVar3) && (value < pNVar1->value)) {
LAB_00105599:
        pNVar1 = rightRotate(this,node);
        return pNVar1;
      }
      if ((-2 < iVar3) || (value <= node_00->value)) {
        if ((1 < iVar3) && (pNVar1->value < value)) {
          pNVar1 = leftRotate(this,pNVar1);
          node->leftChild = pNVar1;
          goto LAB_00105599;
        }
        if (-2 < iVar3) {
          return node;
        }
        if (node_00->value <= value) {
          return node;
        }
        pNVar1 = rightRotate(this,node_00);
        node->rightChild = pNVar1;
      }
      pNVar1 = leftRotate(this,node);
      return pNVar1;
    }
  }
  return node;
}

Assistant:

AvlTree::Node *AvlTree::insert(Node *node, int value) {
    /* 1.  Perform the normal BST insertion */
    if (node == nullptr) {
        return (newNode(value));
    }

    if (value < node->value) {
        node->leftChild = insert(node->leftChild, value);
    } else if (value > node->value) {
        node->rightChild = insert(node->rightChild, value);
    } else {// Equal values are not allowed in BST
        return node;
    }

    /* 2. Update height of this ancestor node */
    node->height = 1 + std::max(height(node->leftChild), height(node->rightChild));

    /* 3. Get the balance factor of this ancestor
          node to check whether this node became
          unbalanced */
    int balance = getBalance(node);

    // If this node becomes unbalanced, then
    // there are 4 cases

    // Left Left Case
    if (balance > 1 && value < node->leftChild->value) {
        return rightRotate(node);
    }

    // Right Right Case
    if (balance < -1 && value > node->rightChild->value) {
        return leftRotate(node);
    }

    // Left Right Case
    if (balance > 1 && value > node->leftChild->value) {
        node->leftChild = leftRotate(node->leftChild);
        return rightRotate(node);
    }

    // Right Left Case
    if (balance < -1 && value < node->rightChild->value) {
        node->rightChild = rightRotate(node->rightChild);
        return leftRotate(node);
    }

    /* return the (unchanged) node pointer */
    return node;
}